

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaffeConverter.cpp
# Opt level: O2

convertCaffeLayerFn *
caffeLayerRegistry(convertCaffeLayerFn *__return_storage_ptr__,string *layerType)

{
  const_iterator cVar1;
  ostream *poVar2;
  runtime_error *this;
  long lVar3;
  undefined1 local_d42;
  undefined1 local_d41;
  string local_d40 [32];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>_>
  CAFFE_LAYER_REGISTRY;
  stringstream ss;
  ostream local_cd8 [48];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_ca8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_c68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_c28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_be8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_ba8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_b68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_b28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_ae8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_aa8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_a68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_a28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_9e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_9a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_968;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_928;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_8e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_8a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_868;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_828;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_7e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_7a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_768;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_728;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_6e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_6a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_668;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_628;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_5e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_5a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_568;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_528;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_4e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_4a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_468;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_428;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_3e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_3a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_328;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_2a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_228;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  local_68;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
              *)&ss,(char (*) [5])0x652a2f,CoreMLConverter::convertCaffeActivation);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_ca8,(char (*) [5])"BNLL",CoreMLConverter::convertCaffeActivation);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_c68,(char (*) [6])0x652a2e,CoreMLConverter::convertCaffeActivation);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_c28,(char (*) [4])0x652b07,CoreMLConverter::convertCaffeActivation);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_be8,(char (*) [8])0x638a06,CoreMLConverter::convertCaffeActivation);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_ba8,(char (*) [5])"TanH",CoreMLConverter::convertCaffeActivation);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_b68,(char (*) [10])0x643eee,CoreMLConverter::convertCaffeParameter);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[13],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_b28,(char (*) [13])"InnerProduct",CoreMLConverter::convertCaffeInnnerProduct);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[12],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_ae8,(char (*) [12])"Convolution",CoreMLConverter::convertCaffeConvolution);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[14],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_aa8,(char (*) [14])"Deconvolution",CoreMLConverter::convertCaffeConvolution);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_a68,(char (*) [4])"LRN",CoreMLConverter::convertCaffeLRN);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_a28,(char (*) [8])"Softmax",CoreMLConverter::convertCaffeSoftmax);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_9e8,(char (*) [8])"Pooling",CoreMLConverter::convertCaffePooling);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[7],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_9a8,(char (*) [7])"Concat",CoreMLConverter::convertCaffeConcat);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_968,(char (*) [5])0x650d34,CoreMLConverter::convertCaffeLSTM);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_928,(char (*) [8])"Eltwise",CoreMLConverter::convertCaffeEltwise);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_8e8,(char (*) [6])"Slice",CoreMLConverter::convertCaffeSlice);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_8a8,(char (*) [8])"Flatten",CoreMLConverter::convertCaffeFlatten);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_868,(char (*) [6])"Embed",CoreMLConverter::convertCaffeEmbed);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_828,(char (*) [6])"Split",CoreMLConverter::convertCaffeSplit);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_7e8,(char (*) [10])"BatchNorm",CoreMLConverter::convertCaffeBatchnorm);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_7a8,(char (*) [6])"Input",CoreMLConverter::convertCaffeInputLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_768,(char (*) [10])"ImageData",CoreMLConverter::convertCaffeInputLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[20],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_728,(char (*) [20])"ImageDataMultiLabel",
             CoreMLConverter::convertCaffeInputLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_6e8,(char (*) [5])0x620dbb,CoreMLConverter::convertCaffeInputLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[9],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_6a8,(char (*) [9])"HDF5Data",CoreMLConverter::convertCaffeInputLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[11],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_668,(char (*) [11])"WindowData",CoreMLConverter::convertCaffeInputLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[11],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_628,(char (*) [11])"MemoryData",CoreMLConverter::convertCaffeInputLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_5e8,(char (*) [10])"DummyData",CoreMLConverter::convertCaffeInputLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[11],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_5a8,(char (*) [11])"HDF5Output",CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_568,(char (*) [5])0x62b1fc,CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[13],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_528,(char (*) [13])"InfogainLoss",CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[14],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_4e8,(char (*) [14])"EuclideanLoss",CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_4a8,(char (*) [8])"Dropout",CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[24],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_468,(char (*) [24])"SigmoidCrossEntropyLoss",
             CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_428,(char (*) [10])"HingeLoss",CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[20],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_3e8,(char (*) [20])"HingeLossMultiLabel",
             CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[9],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_3a8,(char (*) [9])"Accuracy",CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[16],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_368,(char (*) [16])"ContrastiveLoss",CoreMLConverter::convertCaffeTrainingLayers
            );
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[16],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_328,(char (*) [16])"SoftmaxWithLoss",CoreMLConverter::convertCaffeTrainingLayers
            );
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[7],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_2e8,(char (*) [7])"Python",CoreMLConverter::convertCaffeTrainingLayers);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[10],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_2a8,(char (*) [10])"Reduction",CoreMLConverter::convertCaffeReduction);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_268,(char (*) [6])"Scale",CoreMLConverter::convertCaffeScale);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_228,(char (*) [5])0x6202bd,CoreMLConverter::convertCaffeBias);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_1e8,(char (*) [4])"MVN",CoreMLConverter::convertCaffeMVN);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[7],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_1a8,(char (*) [7])"AbsVal",CoreMLConverter::convertCaffeAbs);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_168,(char (*) [4])"Exp",CoreMLConverter::convertCaffeExp);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[6],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_128,(char (*) [6])"Power",CoreMLConverter::convertCaffePower);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[4],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_e8,(char (*) [4])"Log",CoreMLConverter::convertCaffeLog);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[5],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_a8,(char (*) [5])"Crop",CoreMLConverter::convertCaffeCrop);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
  ::pair<const_char_(&)[8],_void_(&)(CoreMLConverter::ConvertLayerParameters),_true>
            (&local_68,(char (*) [8])"Reshape",CoreMLConverter::convertCaffeReshape);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _Hashtable<std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(CoreMLConverter::ConvertLayerParameters)>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&CAFFE_LAYER_REGISTRY,&ss,&stack0xffffffffffffffd8,0,local_d40,&local_d41,&local_d42
            );
  lVar3 = 0xc80;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>
             *)(&ss + lVar3));
    lVar3 = lVar3 + -0x40;
  } while (lVar3 != -0x40);
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&CAFFE_LAYER_REGISTRY._M_h,layerType);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::function<void_(CoreMLConverter::ConvertLayerParameters)>::function
              (__return_storage_ptr__,
               (function<void_(CoreMLConverter::ConvertLayerParameters)> *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_true>
                      ._M_cur + 0x28));
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(CoreMLConverter::ConvertLayerParameters)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&CAFFE_LAYER_REGISTRY._M_h);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_cd8,"Cannot convert caffe layer of type \'");
  poVar2 = std::operator<<(poVar2,(string *)layerType);
  poVar2 = std::operator<<(poVar2,"\'.");
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_d40);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CoreMLConverter::convertCaffeLayerFn
static caffeLayerRegistry(const std::string& layerType) {
    
    const std::unordered_map<std::string, CoreMLConverter::convertCaffeLayerFn> CAFFE_LAYER_REGISTRY {
        {"ReLU", CoreMLConverter::convertCaffeActivation},
        {"BNLL", CoreMLConverter::convertCaffeActivation},
        {"PReLU", CoreMLConverter::convertCaffeActivation},
        {"ELU", CoreMLConverter::convertCaffeActivation},
        {"Sigmoid", CoreMLConverter::convertCaffeActivation},
        {"TanH", CoreMLConverter::convertCaffeActivation},
        {"Parameter", CoreMLConverter::convertCaffeParameter},
        {"InnerProduct", CoreMLConverter::convertCaffeInnnerProduct},
        {"Convolution", CoreMLConverter::convertCaffeConvolution},
        {"Deconvolution", CoreMLConverter::convertCaffeConvolution},
        {"LRN", CoreMLConverter::convertCaffeLRN},
        {"Softmax", CoreMLConverter::convertCaffeSoftmax},
        {"Pooling", CoreMLConverter::convertCaffePooling},
        {"Concat", CoreMLConverter::convertCaffeConcat},
        {"LSTM", CoreMLConverter::convertCaffeLSTM},
        {"Eltwise",CoreMLConverter::convertCaffeEltwise},
        {"Slice",CoreMLConverter::convertCaffeSlice},
        {"Flatten",CoreMLConverter::convertCaffeFlatten},
        {"Embed",CoreMLConverter::convertCaffeEmbed},
        {"Split",CoreMLConverter::convertCaffeSplit},
        {"BatchNorm",CoreMLConverter::convertCaffeBatchnorm},
        {"Input",CoreMLConverter::convertCaffeInputLayers},
        {"ImageData",CoreMLConverter::convertCaffeInputLayers},
        {"ImageDataMultiLabel",CoreMLConverter::convertCaffeInputLayers},
        {"Data",CoreMLConverter::convertCaffeInputLayers},
        {"HDF5Data",CoreMLConverter::convertCaffeInputLayers},
        {"WindowData",CoreMLConverter::convertCaffeInputLayers},
        {"MemoryData",CoreMLConverter::convertCaffeInputLayers},
        {"DummyData",CoreMLConverter::convertCaffeInputLayers},
        {"HDF5Output",CoreMLConverter::convertCaffeTrainingLayers},
        {"Loss",CoreMLConverter::convertCaffeTrainingLayers},
        {"InfogainLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"EuclideanLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"Dropout",CoreMLConverter::convertCaffeTrainingLayers},
        {"SigmoidCrossEntropyLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"HingeLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"HingeLossMultiLabel",CoreMLConverter::convertCaffeTrainingLayers},
        {"Accuracy",CoreMLConverter::convertCaffeTrainingLayers},
        {"ContrastiveLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"SoftmaxWithLoss",CoreMLConverter::convertCaffeTrainingLayers},
        {"Python",CoreMLConverter::convertCaffeTrainingLayers},
        {"Reduction",CoreMLConverter::convertCaffeReduction},
        {"Scale",CoreMLConverter::convertCaffeScale},
        {"Bias",CoreMLConverter::convertCaffeBias},
        {"MVN",CoreMLConverter::convertCaffeMVN},
        {"AbsVal",CoreMLConverter::convertCaffeAbs},
        {"Exp",CoreMLConverter::convertCaffeExp},
        {"Power",CoreMLConverter::convertCaffePower},
        {"Log",CoreMLConverter::convertCaffeLog},
        {"Crop",CoreMLConverter::convertCaffeCrop},
        {"Reshape",CoreMLConverter::convertCaffeReshape}
    };
    
    // Find the layer in the global registry.
    const auto& it = CAFFE_LAYER_REGISTRY.find(layerType);
    if (it != CAFFE_LAYER_REGISTRY.end()) {
        return it->second;
        
    // Layer type not supported.
    } else {
        std::stringstream ss;
        ss << "Cannot convert caffe layer of type '" << layerType << "'." << std::endl;
        throw std::runtime_error(ss.str());
    }
}